

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O1

u32 choose_min_match_len(u32 num_used_literals,u32 max_search_depth)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = 3;
  if (num_used_literals < 0x50) {
    uVar3 = (ulong)num_used_literals;
    uVar1 = (uint)"\t\t\t\t\t\t\b\b\a\a\x06\x06\x06\x06\x06\x06\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04\x04"
                  [uVar3];
    if (max_search_depth < 0x10) {
      if (max_search_depth < 5) {
        bVar4 = uVar3 - 0x2d < 0x23;
        uVar2 = 4;
      }
      else if (max_search_depth < 10) {
        bVar4 = uVar3 - 0x10 < 0x40;
        uVar2 = 5;
      }
      else {
        bVar4 = uVar3 - 8 < 0x48;
        uVar2 = 7;
      }
      if (!bVar4) {
        uVar1 = uVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

static u32
choose_min_match_len(u32 num_used_literals, u32 max_search_depth)
{
	/* map from num_used_literals to min_len */
	static const u8 min_lens[] = {
		9, 9, 9, 9, 9, 9, 8, 8, 7, 7, 6, 6, 6, 6, 6, 6,
		5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5,
		5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 5, 4, 4, 4,
		4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4,
		4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4, 4,
		/* The rest is implicitly 3. */
	};
	u32 min_len;

	STATIC_ASSERT(DEFLATE_MIN_MATCH_LEN <= 3);
	STATIC_ASSERT(ARRAY_LEN(min_lens) <= DEFLATE_NUM_LITERALS + 1);

	if (num_used_literals >= ARRAY_LEN(min_lens))
		return 3;
	min_len = min_lens[num_used_literals];
	/*
	 * With a low max_search_depth, it may be too hard to find long matches.
	 */
	if (max_search_depth < 16) {
		if (max_search_depth < 5)
			min_len = MIN(min_len, 4);
		else if (max_search_depth < 10)
			min_len = MIN(min_len, 5);
		else
			min_len = MIN(min_len, 7);
	}
	return min_len;
}